

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

bool __thiscall testing::internal::MatchMatrix::NextGraph(MatchMatrix *this)

{
  size_t sVar1;
  char *pcVar2;
  reference pvVar3;
  char *b;
  size_t irhs;
  size_t ilhs;
  MatchMatrix *this_local;
  
  irhs = 0;
  do {
    sVar1 = LhsSize(this);
    if (sVar1 <= irhs) {
      return false;
    }
    for (b = (char *)0x0; pcVar2 = (char *)RhsSize(this), b < pcVar2; b = b + 1) {
      sVar1 = SpaceIndex(this,irhs,(size_t)b);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(this + 0x10),sVar1);
      if (*pvVar3 == '\0') {
        *pvVar3 = '\x01';
        return true;
      }
      *pvVar3 = '\0';
    }
    irhs = irhs + 1;
  } while( true );
}

Assistant:

bool MatchMatrix::NextGraph() {
  for (size_t ilhs = 0; ilhs < LhsSize(); ++ilhs) {
    for (size_t irhs = 0; irhs < RhsSize(); ++irhs) {
      char& b = matched_[SpaceIndex(ilhs, irhs)];
      if (!b) {
        b = 1;
        return true;
      }
      b = 0;
    }
  }
  return false;
}